

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O1

cell * references::scheme::proc_mul(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  long lVar2;
  long in_RDX;
  long extraout_RDX;
  scheme *this;
  pointer pcVar3;
  string local_40;
  
  pcVar1 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  this = (scheme *)0x1;
  for (pcVar3 = (c->
                super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                )._M_impl.super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    lVar2 = atol((pcVar3->val)._M_dataplus._M_p);
    this = (scheme *)((long)this * lVar2);
    in_RDX = extraout_RDX;
  }
  str_abi_cxx11_(&local_40,this,in_RDX);
  __return_storage_ptr__->type = Number;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->env = (environment *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cell proc_mul(const cells & c)
{
	long n(1);
	for (cellit i = c.begin(); i != c.end(); ++i) n *= atol(i->val.c_str());
	return cell(Number, str(n));
}